

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

String * __thiscall
Json::Value::toStyledString_abi_cxx11_(String *__return_storage_ptr__,Value *this)

{
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var1;
  Value *in_RCX;
  char *__s;
  String local_60;
  StreamWriterBuilder builder;
  
  StreamWriterBuilder::StreamWriterBuilder(&builder);
  _Var1._M_head_impl =
       (this->comments_).ptr_._M_t.
       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       .
       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
       ._M_head_impl;
  if (_Var1._M_head_impl ==
      (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL> *
      )0x0) {
    __s = "";
  }
  else {
    __s = "\n";
    if (*(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 8) == 0) {
      __s = "";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_60);
  writeString_abi_cxx11_(&local_60,(Json *)&builder,(Factory *)this,in_RCX);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  StreamWriterBuilder::~StreamWriterBuilder(&builder);
  return __return_storage_ptr__;
}

Assistant:

String Value::toStyledString() const {
  StreamWriterBuilder builder;

  String out = this->hasComment(commentBefore) ? "\n" : "";
  out += Json::writeString(builder, *this);
  out += '\n';

  return out;
}